

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pardiso_interface.c
# Opt level: O0

c_int update_linsys_solver_matrices_pardiso(pardiso_solver *s,csc *P,csc *A)

{
  csc *in_RDX;
  c_int *unaff_RBX;
  csc *in_RSI;
  c_int *in_RDI;
  c_int *unaff_R12;
  void **unaff_R13;
  c_float *in_stack_00000020;
  c_int *in_stack_00000028;
  c_int *in_stack_00000030;
  c_int *in_stack_00000038;
  c_int *in_stack_00000040;
  c_int *in_stack_00000048;
  c_int *in_stack_00000050;
  c_float *in_stack_00000058;
  
  update_KKT_P((csc *)in_RDI[6],in_RSI,(c_int *)in_RDI[0x9c],(c_float)in_RDI[0xc],
               (c_int *)in_RDI[0x9a],in_RDI[0x9b]);
  update_KKT_A((csc *)in_RDI[6],in_RDX,(c_int *)in_RDI[0x9d]);
  in_RDI[0x95] = 0x16;
  pardiso(unaff_R13,unaff_R12,unaff_RBX,in_RDI,&in_RSI->nzmax,&in_RDX->nzmax,in_stack_00000020,
          in_stack_00000028,in_stack_00000030,in_stack_00000038,in_stack_00000040,in_stack_00000048,
          in_stack_00000050,in_stack_00000058,(c_float *)A,&P->nzmax);
  return in_RDI[0x96];
}

Assistant:

c_int update_linsys_solver_matrices_pardiso(pardiso_solver * s, const csc *P, const csc *A) {

    // Update KKT matrix with new P
    update_KKT_P(s->KKT, P, s->PtoKKT, s->sigma, s->Pdiag_idx, s->Pdiag_n);

    // Update KKT matrix with new A
    update_KKT_A(s->KKT, A, s->AtoKKT);

    // Perform numerical factorization
    s->phase = PARDISO_NUMERIC;
    pardiso (s->pt, &(s->maxfct), &(s->mnum), &(s->mtype), &(s->phase),
             &(s->nKKT), s->KKT->x, s->KKT_p, s->KKT_i, &(s->idum), &(s->nrhs),
             s->iparm, &(s->msglvl), &(s->fdum), &(s->fdum), &(s->error));

    // Return exit flag
    return s->error;
}